

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O1

SPOTTYPE * board_getSpotTypes(Board *board,uchar *spotTypesCountResult)

{
  Spot *pSVar1;
  SPOTTYPE *__ptr;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  
  if (board->spotsCount == '\0') {
    bVar3 = 0;
    __ptr = (SPOTTYPE *)0x0;
  }
  else {
    uVar4 = 0;
    __ptr = (SPOTTYPE *)0x0;
    bVar3 = 0;
    do {
      pSVar1 = board->spots[uVar4];
      if (bVar3 != 0) {
        lVar2 = 0;
        do {
          if (__ptr[lVar2] == pSVar1->type) goto LAB_001060b3;
          lVar2 = lVar2 + 1;
        } while (bVar3 != (byte)lVar2);
      }
      bVar3 = bVar3 + 1;
      __ptr = (SPOTTYPE *)realloc(__ptr,(ulong)bVar3);
      __ptr[(ulong)bVar3 - 1] = pSVar1->type;
LAB_001060b3:
      uVar4 = uVar4 + 1;
    } while (uVar4 < board->spotsCount);
  }
  *spotTypesCountResult = bVar3;
  return __ptr;
}

Assistant:

SPOTTYPE * board_getSpotTypes(Board * board, unsigned char * spotTypesCountResult)
{
	unsigned char i, j, spotTypesCount=0;
	bool hasType;
	SPOTTYPE * spotTypes = 0;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];
		hasType = false;
		for(j=0;j<spotTypesCount;j++)
		{
			if(spotTypes[j]==spot->type)
			{
				hasType = true;
				break;
			}
		}

		if(!hasType)
		{
			spotTypesCount++;
			// cppcheck-suppress memleakOnRealloc
			spotTypes = (SPOTTYPE *)realloc(spotTypes, sizeof(SPOTTYPE)*spotTypesCount);
			spotTypes[(spotTypesCount-1)] = spot->type;
		}
	}

	*spotTypesCountResult = spotTypesCount;

	return spotTypes;
}